

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O2

void __thiscall soul::heart::WriteStream::visitExpressions(WriteStream *this,ExpressionVisitorFn fn)

{
  Expression *in_RAX;
  Expression *pEVar1;
  pool_ref<soul::heart::Expression> ref;
  pool_ptr<soul::heart::Expression> local_28;
  
  if ((this->element).object != (Expression *)0x0) {
    local_28.object = in_RAX;
    pEVar1 = pool_ptr<soul::heart::Expression>::operator->(&this->element);
    (*(pEVar1->super_Object)._vptr_Object[3])(pEVar1,fn,0);
    pool_ptr<soul::heart::Expression>::getAsPoolRef(&local_28);
    std::function<void_(soul::pool_ref<soul::heart::Expression>_&,_soul::AccessType)>::operator()
              (fn,(pool_ref<soul::heart::Expression> *)&local_28,read);
    (this->element).object = local_28.object;
  }
  pEVar1 = (this->value).object;
  (*(pEVar1->super_Object)._vptr_Object[3])(pEVar1,fn,0);
  std::function<void_(soul::pool_ref<soul::heart::Expression>_&,_soul::AccessType)>::operator()
            (fn,&this->value,read);
  return;
}

Assistant:

void visitExpressions (ExpressionVisitorFn fn) override
        {
            if (element != nullptr)
            {
                element->visitExpressions (fn, AccessType::read);
                auto ref = element.getAsPoolRef();
                fn (ref, AccessType::read);
                element = ref;
            }

            value->visitExpressions (fn, AccessType::read);
            fn (value, AccessType::read);
        }